

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer(ExistingFileNamer *this,ExistingFileNamer *x)

{
  (this->super_ApprovalNamer)._vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_001bc648;
  ::std::__cxx11::string::string((string *)&this->filePath,(string *)&x->filePath);
  this->options_ = x->options_;
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(const ExistingFileNamer& x)
        : filePath(x.filePath), options_(x.options_)
    {
    }